

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilesystemTest.cc
# Opt level: O0

int main(int param_1,char **param_2)

{
  pointer *__return_storage_ptr__;
  __node_base_ptr *this;
  initializer_list<std::pair<const_int,_short>_> __l;
  bool bVar1;
  __type pred;
  uint uVar2;
  int iVar3;
  size_type sVar4;
  size_type sVar5;
  char *pcVar6;
  char *__to;
  stat *__buf;
  FILE *pFVar7;
  int fd;
  size_t size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  unordered_map<int,_short,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_short>_>_>
  local_718;
  allocator<std::pair<const_int,_short>_> local_6df;
  key_equal local_6de;
  hasher local_6dd;
  int local_6dc;
  pair<const_int,_short> local_6d8;
  iterator local_6d0;
  size_type local_6c8;
  undefined1 local_6c0 [8];
  unordered_map<int,_short,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_short>_>_>
  expected_result;
  Poll poll;
  undefined8 local_650;
  pair<int,_int> p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  char local_5e8 [48];
  long local_5b8;
  undefined1 local_558 [48];
  size_type local_528;
  undefined1 local_4c8 [48];
  size_type local_498;
  allocator<char> local_431;
  string local_430;
  undefined1 local_410 [8];
  unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> f;
  size_type local_3d0;
  char local_370 [48];
  size_type local_340;
  char local_2e0 [48];
  size_type local_2b0;
  char local_250 [48];
  size_type local_220;
  string local_1c0;
  allocator<char> local_199;
  undefined1 local_198 [8];
  string data;
  undefined1 local_170 [8];
  string symlink_name;
  undefined1 local_148 [8];
  string filename;
  key_type local_120;
  allocator<char> local_f9;
  key_type local_f8;
  allocator<char> local_d1;
  key_type local_d0;
  allocator<char> local_a9;
  key_type local_a8;
  allocator<char> local_71;
  string local_70;
  undefined1 local_50 [8];
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  results;
  char **param_1_local;
  int param_0_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,".",&local_71);
  phosg::list_directory
            ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"FilesystemTest",&local_a9)
  ;
  sVar4 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_50,&local_a8);
  phosg::expect_generic
            (sVar4 == 1,"1 != results.count(\"FilesystemTest\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x11);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"the-test-will-fail-if-this-file-exists",&local_d1);
  sVar4 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_50,&local_d0);
  phosg::expect_generic
            (sVar4 == 0,"0 != results.count(\"the-test-will-fail-if-this-file-exists\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x13);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,".",&local_f9);
  sVar4 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_50,&local_f8);
  phosg::expect_generic
            (sVar4 == 0,"0 != results.count(\".\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x14);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"..",(allocator<char> *)(filename.field_2._M_local_buf + 0xf));
  sVar4 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_50,&local_120);
  phosg::expect_generic
            (sVar4 == 0,"0 != results.count(\"..\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x15);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)(filename.field_2._M_local_buf + 0xf));
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_148,"FilesystemTest-data",
             (allocator<char> *)(symlink_name.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(symlink_name.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_170,"FilesystemTest-link",
             (allocator<char> *)(data.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(data.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_198,"0123456789",&local_199);
  std::allocator<char>::~allocator(&local_199);
  phosg::save_file((string *)local_148,(string *)local_198);
  phosg::load_file(&local_1c0,(string *)local_148);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_1c0,"0123456789");
  phosg::expect_generic
            (bVar1,"\"0123456789\" != load_file(filename)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x1f);
  std::__cxx11::string::~string((string *)&local_1c0);
  sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198)
  ;
  phosg::stat(local_250,(stat *)local_148);
  phosg::expect_generic
            (sVar5 == local_220,"data.size() != (size_t)stat(filename).st_size",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x21);
  sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198)
  ;
  phosg::lstat(local_2e0,(stat *)local_148);
  phosg::expect_generic
            (sVar5 == local_2b0,"data.size() != (size_t)lstat(filename).st_size",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x23);
  pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148
                     );
  __to = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170);
  symlink(pcVar6,__to);
  sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198)
  ;
  phosg::stat(local_370,(stat *)local_170);
  phosg::expect_generic
            (sVar5 == local_340,"data.size() != (size_t)stat(symlink_name).st_size",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x27);
  sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148)
  ;
  phosg::lstat((char *)&f._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
                        super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.
                        super__Head_base<0UL,__IO_FILE_*,_false>,(stat *)local_170);
  phosg::expect_generic
            (sVar5 == local_3d0,"filename.size() != (size_t)lstat(symlink_name).st_size",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,"r+b",&local_431);
  phosg::fopen_unique((phosg *)local_410,(string *)local_148,&local_430,(FILE *)0x0);
  std::__cxx11::string::~string((string *)&local_430);
  std::allocator<char>::~allocator(&local_431);
  sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198)
  ;
  __buf = (stat *)std::unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)>::get
                            ((unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> *)local_410);
  phosg::fstat((int)local_4c8,__buf);
  phosg::expect_generic
            (sVar5 == local_498,"data.size() != (size_t)fstat(f.get()).st_size",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x2d);
  sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198)
  ;
  pFVar7 = (FILE *)std::unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)>::get
                             ((unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> *)local_410);
  uVar2 = fileno(pFVar7);
  phosg::fstat((int)local_558,(stat *)(ulong)uVar2);
  phosg::expect_generic
            (sVar5 == local_528,"data.size() != (size_t)fstat(fileno(f.get())).st_size",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x2e);
  pFVar7 = (FILE *)std::unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)>::get
                             ((unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> *)local_410);
  fseek(pFVar7,5,0);
  pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198
                     );
  sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198)
  ;
  pFVar7 = (FILE *)std::unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)>::get
                             ((unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> *)local_410);
  fwrite(pcVar6,1,sVar5,pFVar7);
  std::unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)>::~unique_ptr
            ((unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> *)local_410);
  sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198)
  ;
  phosg::stat(local_5e8,(stat *)local_170);
  phosg::expect_generic
            (sVar5 + 5 == local_5b8,"data.size() + 5 != (size_t)stat(symlink_name).st_size",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x34);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_628,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,0,5);
  std::operator+(&local_608,&local_628,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198);
  phosg::load_file((string *)&p,(string *)local_170);
  pred = std::operator==(&local_608,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p);
  size = 0x35;
  phosg::expect_generic
            (pred,"data.substr(0, 5) + data != load_file(symlink_name)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x35);
  std::__cxx11::string::~string((string *)&p);
  std::__cxx11::string::~string((string *)&local_608);
  std::__cxx11::string::~string((string *)&local_628);
  std::__cxx11::string::~string((string *)local_198);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148;
  pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (this_00);
  remove(pcVar6);
  pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170
                     );
  remove(pcVar6);
  std::__cxx11::string::~string((string *)local_170);
  std::__cxx11::string::~string((string *)this_00);
  iVar3 = phosg::pipe((int *)this_00);
  local_650 = CONCAT44(fd,iVar3);
  phosg::writex(fd,"omg",3);
  __return_storage_ptr__ =
       &poll.poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  phosg::readx_abi_cxx11_((string *)__return_storage_ptr__,(phosg *)(local_650 & 0xffffffff),3,size)
  ;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          __return_storage_ptr__,"omg");
  phosg::expect_generic
            (bVar1,"\"omg\" != readx(p.first, 3)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x49);
  std::__cxx11::string::~string
            ((string *)
             &poll.poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  this = &expected_result._M_h._M_single_bucket;
  phosg::Poll::Poll((Poll *)this);
  phosg::Poll::add((Poll *)this,(int)local_650,1);
  phosg::Poll::add((Poll *)&expected_result._M_h._M_single_bucket,local_650._4_4_,4);
  local_6dc = 4;
  std::pair<const_int,_short>::pair<int_&,_int,_true>
            (&local_6d8,(int *)((long)&local_650 + 4),&local_6dc);
  local_6d0 = &local_6d8;
  local_6c8 = 1;
  std::allocator<std::pair<const_int,_short>_>::allocator(&local_6df);
  __l._M_len = local_6c8;
  __l._M_array = local_6d0;
  iVar3 = 0;
  std::
  unordered_map<int,_short,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_short>_>_>
  ::unordered_map((unordered_map<int,_short,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_short>_>_>
                   *)local_6c0,__l,0,&local_6dd,&local_6de,&local_6df);
  std::allocator<std::pair<const_int,_short>_>::~allocator(&local_6df);
  phosg::Poll::poll((Poll *)&local_718,(pollfd *)&expected_result._M_h._M_single_bucket,0,iVar3);
  bVar1 = std::operator==((unordered_map<int,_short,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_short>_>_>
                           *)local_6c0,&local_718);
  phosg::expect_generic
            (bVar1,"expected_result != poll.poll()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x4f);
  std::
  unordered_map<int,_short,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_short>_>_>
  ::~unordered_map(&local_718);
  phosg::Poll::remove((Poll *)&expected_result._M_h._M_single_bucket,
                      (char *)(local_650 & 0xffffffff));
  phosg::Poll::remove((Poll *)&expected_result._M_h._M_single_bucket,(char *)(local_650 >> 0x20));
  std::
  unordered_map<int,_short,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_short>_>_>
  ::~unordered_map((unordered_map<int,_short,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_short>_>_>
                    *)local_6c0);
  phosg::Poll::~Poll((Poll *)&expected_result._M_h._M_single_bucket);
  printf("FilesystemTest: all tests passed\n");
  return 0;
}

Assistant:

int main(int, char**) {
  {
    auto results = list_directory(".");
#ifdef PHOSG_WINDOWS
    expect_eq(1, results.count("FilesystemTest.exe"));
#else
    expect_eq(1, results.count("FilesystemTest"));
#endif
    expect_eq(0, results.count("the-test-will-fail-if-this-file-exists"));
    expect_eq(0, results.count("."));
    expect_eq(0, results.count(".."));
  }

  {
    string filename("FilesystemTest-data");
    string symlink_name("FilesystemTest-link");
    try {
      string data("0123456789");

      save_file(filename, data);
      expect_eq("0123456789", load_file(filename));

      expect_eq(data.size(), (size_t)stat(filename).st_size);
#ifndef PHOSG_WINDOWS
      expect_eq(data.size(), (size_t)lstat(filename).st_size);

      symlink(filename.c_str(), symlink_name.c_str());

      expect_eq(data.size(), (size_t)stat(symlink_name).st_size);
      expect_eq(filename.size(), (size_t)lstat(symlink_name).st_size);
#endif

      {
        auto f = fopen_unique(filename, "r+b");
        expect_eq(data.size(), (size_t)fstat(f.get()).st_size);
        expect_eq(data.size(), (size_t)fstat(fileno(f.get())).st_size);
        fseek(f.get(), 5, SEEK_SET);
        fwrite(data.data(), 1, data.size(), f.get());
      }

#ifndef PHOSG_WINDOWS
      expect_eq(data.size() + 5, (size_t)stat(symlink_name).st_size);
      expect_eq(data.substr(0, 5) + data, load_file(symlink_name));
#endif

    } catch (...) {
      remove(filename.c_str());
#ifndef PHOSG_WINDOWS
      remove(symlink_name.c_str());
#endif
      throw;
    }
    remove(filename.c_str());
#ifndef PHOSG_WINDOWS
    remove(symlink_name.c_str());
#endif
  }

#ifndef PHOSG_WINDOWS
  {
    auto p = pipe();
    writex(p.second, "omg", 3);
    expect_eq("omg", readx(p.first, 3));

    Poll poll;
    poll.add(p.first, POLLIN);
    poll.add(p.second, POLLOUT);
    unordered_map<int, short> expected_result({{p.second, POLLOUT}});
    expect_eq(expected_result, poll.poll());
    poll.remove(p.first, true);
    poll.remove(p.second, true);
  }
#endif

  // TODO: test get_user_home_directory

  printf("FilesystemTest: all tests passed\n");
  return 0;
}